

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

void Dtt_FunImplFI2Str(int FI,int NP,Vec_Int_t *vLibFun,char *str)

{
  long lVar1;
  int N [5];
  int P [5];
  
  lVar1 = 0;
  do {
    P[lVar1] = NP & 7;
    N[lVar1] = (uint)NP >> 3 & 1;
    NP = NP >> 4;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  if ((-1 < FI) && (FI < vLibFun->nSize)) {
    sprintf(str,"[%08x(%03d),%d%d%d%d%d,%d%d%d%d%d]",(ulong)(uint)vLibFun->pArray[(uint)FI],
            (ulong)(uint)FI,(ulong)(uint)P[0],(ulong)(uint)P[1],(ulong)(uint)P[2],(ulong)(uint)P[3],
            (ulong)(uint)P[4],(ulong)(uint)N[0],(ulong)(uint)N[1],(ulong)(uint)N[2],
            (ulong)(uint)N[3],(ulong)(uint)N[4]);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Dtt_FunImplFI2Str( int FI, int NP, Vec_Int_t* vLibFun, char* str )
{
    int i, P[5], N[5];
    for ( i = 0; i < 5; i++ )
    {
        P[i] = NP & 0x7;
        NP = NP >> 3;
        N[i] = NP & 0x1;
        NP = NP >> 1 ;
    }
    sprintf( str, "[%08x(%03d),%d%d%d%d%d,%d%d%d%d%d]", Vec_IntEntry( vLibFun, FI ), FI, P[0], P[1], P[2], P[3], P[4], N[0], N[1], N[2], N[3], N[4] ); 
}